

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O3

void __thiscall PersistenceTest::prepare(PersistenceTest *this,uint64_t max)

{
  KVStore *this_00;
  uint64_t uVar1;
  PersistenceTest *this_01;
  bool bVar2;
  ostream *poVar3;
  uint64_t uVar4;
  char cVar5;
  char *__end;
  long lVar6;
  string local_a0;
  PersistenceTest *local_80;
  uint64_t local_78;
  string local_70;
  string local_50;
  
  this_00 = &(this->super_Test).store;
  KVStore::reset(this_00);
  local_80 = this;
  local_78 = max;
  if (max == 0) {
    Test::phase(&this->super_Test);
    Test::phase(&this->super_Test);
    Test::phase(&this->super_Test);
    Test::phase(&this->super_Test);
LAB_00104573:
    Test::phase(&this->super_Test);
  }
  else {
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar1);
      KVStore::put(this_00,uVar4,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar1);
      KVStore::get_abi_cxx11_(&local_70,this_00,uVar4);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
                 ,"");
      Test::expect<std::__cxx11::string>(&local_80->super_Test,&local_a0,&local_70,&local_50,0x15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar1;
    } while (local_78 != uVar1);
    Test::phase(&local_80->super_Test);
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar1);
      KVStore::get_abi_cxx11_(&local_70,this_00,uVar4);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
                 ,"");
      Test::expect<std::__cxx11::string>(&local_80->super_Test,&local_a0,&local_70,&local_50,0x1b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar1;
    } while (local_78 != uVar1);
    Test::phase(&local_80->super_Test);
    uVar4 = 0;
    do {
      local_70._M_dataplus._M_p._0_1_ = 1;
      bVar2 = KVStore::del(this_00,uVar4);
      local_50._M_dataplus._M_p._0_1_ = bVar2;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
                 ,"");
      Test::expect<bool>(&local_80->super_Test,(bool *)&local_70,(bool *)&local_50,&local_a0,0x20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar4 + 2;
    } while (uVar4 < local_78);
    Test::phase(&local_80->super_Test);
    uVar4 = 0;
    do {
      KVStore::get_abi_cxx11_(&local_a0,this_00,uVar4);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
                 ,"");
      Test::expect<std::__cxx11::string>
                (&local_80->super_Test,&Test::not_found_abi_cxx11_,&local_a0,&local_70,0x24);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar4 + '\x01');
      KVStore::put(this_00,uVar4,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      this = local_80;
      uVar4 = uVar4 + 4;
    } while (uVar4 < local_78);
    Test::phase(&local_80->super_Test);
    if (local_78 == 1) goto LAB_00104573;
    uVar4 = 1;
    do {
      cVar5 = (char)uVar4 + '\x01';
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,cVar5);
      KVStore::get_abi_cxx11_(&local_70,this_00,uVar4);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
                 ,"");
      Test::expect<std::__cxx11::string>(&local_80->super_Test,&local_a0,&local_70,&local_50,0x29);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,cVar5);
      KVStore::put(this_00,uVar4,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      this = local_80;
      uVar4 = uVar4 + 4;
    } while (uVar4 < local_78);
    Test::phase(&local_80->super_Test);
    if (2 < local_78) {
      uVar4 = 2;
      do {
        KVStore::get_abi_cxx11_(&local_a0,this_00,uVar4);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
                   ,"");
        Test::expect<std::__cxx11::string>
                  (&local_80->super_Test,&Test::not_found_abi_cxx11_,&local_a0,&local_70,0x2e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        uVar4 = uVar4 + 4;
      } while (uVar4 < local_78);
      Test::phase(&local_80->super_Test);
      if (local_78 != 3) {
        uVar4 = 3;
        do {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar4 + '\x01');
          KVStore::get_abi_cxx11_(&local_70,this_00,uVar4);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
                     ,"");
          Test::expect<std::__cxx11::string>
                    (&local_80->super_Test,&local_a0,&local_70,&local_50,0x32);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          uVar4 = uVar4 + 4;
        } while (uVar4 < local_78);
      }
      goto LAB_00104583;
    }
  }
  Test::phase(&this->super_Test);
LAB_00104583:
  this_01 = local_80;
  Test::phase(&local_80->super_Test);
  Test::report(&this_01->super_Test);
  uVar4 = local_78;
  lVar6 = 0;
  do {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_a0,'\0');
    KVStore::put(this_00,lVar6 + uVar4,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x2801);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Data is ready, please press ctrl-c/ctrl-d to terminate this program!");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  exit(0);
}

Assistant:

void prepare(uint64_t max) {
        uint64_t i;

        // Clean up
        store.reset();

        // Test multiple key-value pairs
        for (i = 0; i < max; ++i) {
            store.put(i, std::string(i + 1, 's'));
            EXPECT(std::string(i + 1, 's'), store.get(i));
        }
        phase();

        // Test after all insertions
        for (i = 0; i < max; ++i)
            EXPECT(std::string(i + 1, 's'), store.get(i));
        phase();

        // Test deletions
        for (i = 0; i < max; i += 2)
            EXPECT(true, store.del(i));

        phase();
        for (int i = 0; i < max; i += 4) {
            EXPECT(not_found, store.get(i));
            store.put(i, std::string(i + 1, 't'));
        }
        phase();
        for (int j = 1; j < max; j += 4) {
            EXPECT(std::string(j + 1, 's'), store.get(j));
            store.put(j, std::string(j + 1, 't'));
        }
        phase();
        for (int k = 2; k < max; k += 4) {
            EXPECT(not_found, store.get(k));
        }
        phase();
        for (int l = 3; l < max; l += 4) {
            EXPECT(std::string(l + 1, 's'), store.get(l));
        }
        phase();
        // Prepare data for Test Mode
        /*for (i = 0; i < max; ++i) {
            switch (i & 3) {
                case 0:
                    EXPECT(not_found, store.get(i));
                    store.put(i, std::string(i + 1, 't'));
                    break;
                case 1:
                    EXPECT(std::string(i + 1, 's'), store.get(i));
                    store.put(i, std::string(i + 1, 't'));
                    break;
                case 2:
                    EXPECT(not_found, store.get(i));
                    break;
                case 3:
                    EXPECT(std::string(i + 1, 's'), store.get(i));
                    break;
                default:
                    assert(0);
            }
        }*/

        report();

        /**
         * Write 10MB data to drain previous data out of memory.
         */
        for (i = 0; i <= 10240; ++i)
            store.put(max + i, std::string(1024, 'x'));

        std::cout << "Data is ready, please press ctrl-c/ctrl-d to"
                     " terminate this program!" << std::endl;
        std::cout.flush();

        exit(0);
    }